

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O1

void cali_config_preset(char *key,char *value)

{
  bool bVar1;
  int iVar2;
  ostream *this;
  size_t sVar3;
  allocator<char> local_231;
  RuntimeConfig local_230;
  undefined1 local_220 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210 [14];
  ios_base local_128 [264];
  int local_20;
  
  bVar1 = cali::Caliper::is_initialized();
  if (bVar1) {
    this = (ostream *)local_220;
    std::ofstream::ofstream(this);
    local_20 = 0;
    iVar2 = cali::Log::verbosity();
    if (local_20 <= iVar2) {
      this = cali::Log::get_stream((Log *)local_220);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (this,"Warning: Caliper is already initialized. ",0x29);
    std::__ostream_insert<char,std::char_traits<char>>(this,"cali_config_preset(\"",0x14);
    if (key == (char *)0x0) {
      std::ios::clear((int)this + (int)*(undefined8 *)(*(long *)this + -0x18));
    }
    else {
      sVar3 = strlen(key);
      std::__ostream_insert<char,std::char_traits<char>>(this,key,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(this,"\", \"",4);
    if (value == (char *)0x0) {
      std::ios::clear((int)this + (int)*(undefined8 *)(*(long *)this + -0x18));
    }
    else {
      sVar3 = strlen(value);
      std::__ostream_insert<char,std::char_traits<char>>(this,value,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(this,"\") has no effect.",0x11);
    std::ios::widen((char)*(undefined8 *)(*(long *)this + -0x18) + (char)this);
    std::ostream::put((char)this);
    std::ostream::flush();
    local_220._0_8_ = _VTT;
    *(undefined8 *)(local_220 + *(long *)(_VTT->_M_local_buf + -0x18)) =
         ___throw_bad_array_new_length;
    std::filebuf::~filebuf((filebuf *)(local_220 + 8));
    std::ios_base::~ios_base(local_128);
  }
  cali::RuntimeConfig::get_default_config();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_220,value,&local_231);
  cali::RuntimeConfig::preset(&local_230,key,(string *)local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._0_8_ != local_210) {
    operator_delete((void *)local_220._0_8_,local_210[0]._M_allocated_capacity + 1);
  }
  if (local_230.mP.
      super___shared_ptr<cali::RuntimeConfig::RuntimeConfigImpl,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_230.mP.
               super___shared_ptr<cali::RuntimeConfig::RuntimeConfigImpl,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void cali_config_preset(const char* key, const char* value)
{
    if (Caliper::is_initialized())
        Log(0).stream() << "Warning: Caliper is already initialized. "
                        << "cali_config_preset(\"" << key << "\", \"" << value << "\") has no effect." << std::endl;

    RuntimeConfig::get_default_config().preset(key, value);
}